

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::ColorPickerOptionsPopup(float *ref_col,ImGuiColorEditFlags flags)

{
  bool bVar1;
  int iVar2;
  uint in_ESI;
  void *in_RDI;
  float _x;
  float fVar3;
  ImVec4 dummy_ref_col;
  ImVec2 backup_pos;
  ImGuiColorEditFlags picker_flags;
  int picker_type;
  ImVec2 picker_size;
  ImGuiContext *g;
  bool allow_opt_alpha_bar;
  bool allow_opt_picker;
  ImVec2 *in_stack_000000d8;
  ImGuiSelectableFlags in_stack_000000e0;
  bool in_stack_000000e7;
  char *in_stack_000000e8;
  float *in_stack_00000448;
  ImGuiColorEditFlags in_stack_00000454;
  float *in_stack_00000458;
  char *in_stack_00000460;
  uint *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  uint3 in_stack_ffffffffffffffbc;
  uint uVar4;
  undefined1 local_40 [4];
  float in_stack_ffffffffffffffc4;
  uint local_28;
  int local_24;
  ImVec2 local_20;
  ImGuiContext *local_18;
  byte local_e;
  byte local_d;
  uint local_c;
  void *local_8;
  
  local_d = ((in_ESI & 0x6000000) != 0 ^ 0xffU) & 1;
  uVar4 = (uint)in_stack_ffffffffffffffbc;
  if ((in_ESI & 2) == 0) {
    uVar4 = CONCAT13((in_ESI & 0x10000) != 0,in_stack_ffffffffffffffbc) ^ 0xff000000;
  }
  local_e = (byte)(uVar4 >> 0x18) & 1;
  if (((local_d != 0) || ((uVar4 & 0x1000000) != 0)) &&
     (local_c = in_ESI, local_8 = in_RDI,
     bVar1 = BeginPopup((char *)CONCAT44(uVar4,in_stack_ffffffffffffffb8),
                        (ImGuiWindowFlags)in_stack_ffffffffffffffb4), bVar1)) {
    local_18 = GImGui;
    if ((local_d & 1) != 0) {
      _x = GImGui->FontSize * 8.0;
      in_stack_ffffffffffffffb4 = GImGui->FontSize;
      fVar3 = GetFrameHeight();
      fVar3 = ImMax<float>(in_stack_ffffffffffffffb4 * 8.0 +
                           -(fVar3 + (local_18->Style).ItemInnerSpacing.x),1.0);
      ImVec2::ImVec2(&local_20,_x,fVar3);
      PushItemWidth(in_stack_ffffffffffffffb4);
      for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
        if (0 < local_24) {
          Separator();
        }
        PushID((int)in_stack_ffffffffffffffc4);
        local_28 = local_c & 2;
        if (local_24 == 0) {
          local_28 = local_28 | 0x20001a8;
        }
        if (local_24 == 1) {
          local_28 = local_28 | 0x4000000;
        }
        GetCursorScreenPos();
        bVar1 = Selectable(in_stack_000000e8,in_stack_000000e7,in_stack_000000e0,in_stack_000000d8);
        if (bVar1) {
          local_18->ColorEditOptions =
               local_18->ColorEditOptions & 0xf9ffffffU | local_28 & 0x6000000;
        }
        SetCursorScreenPos((ImVec2 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
        ImVec4::ImVec4((ImVec4 *)local_40);
        iVar2 = 4;
        if ((local_28 & 2) != 0) {
          iVar2 = 3;
        }
        memcpy(local_40,local_8,(long)iVar2 << 2);
        ColorPicker4(in_stack_00000460,in_stack_00000458,in_stack_00000454,in_stack_00000448);
        PopID();
      }
      PopItemWidth();
    }
    if ((local_e & 1) != 0) {
      if ((local_d & 1) != 0) {
        Separator();
      }
      CheckboxFlags((char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                    in_stack_ffffffffffffffa8,0);
    }
    EndPopup();
  }
  return;
}

Assistant:

void ImGui::ColorPickerOptionsPopup(const float* ref_col, ImGuiColorEditFlags flags)
{
    bool allow_opt_picker = !(flags & ImGuiColorEditFlags__PickerMask);
    bool allow_opt_alpha_bar = !(flags & ImGuiColorEditFlags_NoAlpha) && !(flags & ImGuiColorEditFlags_AlphaBar);
    if ((!allow_opt_picker && !allow_opt_alpha_bar) || !BeginPopup("context"))
        return;
    ImGuiContext& g = *GImGui;
    if (allow_opt_picker)
    {
        ImVec2 picker_size(g.FontSize * 8, ImMax(g.FontSize * 8 - (GetFrameHeight() + g.Style.ItemInnerSpacing.x), 1.0f)); // FIXME: Picker size copied from main picker function
        PushItemWidth(picker_size.x);
        for (int picker_type = 0; picker_type < 2; picker_type++)
        {
            // Draw small/thumbnail version of each picker type (over an invisible button for selection)
            if (picker_type > 0) Separator();
            PushID(picker_type);
            ImGuiColorEditFlags picker_flags = ImGuiColorEditFlags_NoInputs|ImGuiColorEditFlags_NoOptions|ImGuiColorEditFlags_NoLabel|ImGuiColorEditFlags_NoSidePreview|(flags & ImGuiColorEditFlags_NoAlpha);
            if (picker_type == 0) picker_flags |= ImGuiColorEditFlags_PickerHueBar;
            if (picker_type == 1) picker_flags |= ImGuiColorEditFlags_PickerHueWheel;
            ImVec2 backup_pos = GetCursorScreenPos();
            if (Selectable("##selectable", false, 0, picker_size)) // By default, Selectable() is closing popup
                g.ColorEditOptions = (g.ColorEditOptions & ~ImGuiColorEditFlags__PickerMask) | (picker_flags & ImGuiColorEditFlags__PickerMask);
            SetCursorScreenPos(backup_pos);
            ImVec4 dummy_ref_col;
            memcpy(&dummy_ref_col, ref_col, sizeof(float) * ((picker_flags & ImGuiColorEditFlags_NoAlpha) ? 3 : 4));
            ColorPicker4("##dummypicker", &dummy_ref_col.x, picker_flags);
            PopID();
        }
        PopItemWidth();
    }
    if (allow_opt_alpha_bar)
    {
        if (allow_opt_picker) Separator();
        CheckboxFlags("Alpha Bar", (unsigned int*)&g.ColorEditOptions, ImGuiColorEditFlags_AlphaBar);
    }
    EndPopup();
}